

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O2

void __thiscall Arena_Guard_Test::TestBody(Arena_Guard_Test *this)

{
  bool bVar1;
  void *pvVar2;
  size_t size;
  long lVar3;
  pointer *__ptr;
  char *in_R9;
  Guard g2;
  Guard g4;
  Guard g1;
  Guard g5;
  Guard noop;
  Arena arena;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  Guard local_80;
  Guard emptyGuard;
  void *local_60;
  AssertionResult gtest_ar__2;
  AssertHelper local_48;
  Guard emptyGuard2;
  
  memt::Arena::Arena(&arena);
  noop.mPosition = arena._blocks._block._position;
  if (arena._blocks._block._position == arena._blocks._block._begin) {
    if (arena._blocks._block._previous == (Block *)0x0) {
      noop.mPosition = (char *)0x0;
    }
    else {
      noop.mPosition = (arena._blocks._block._previous)->_position;
    }
  }
  noop.mArena = &arena;
  memt::Arena::Guard::~Guard(&noop);
  if (arena._blocks._block._position == arena._blocks._block._begin) {
    if (arena._blocks._block._previous == (Block *)0x0) {
      noop.mPosition = (void *)0x0;
      emptyGuard.mPosition = (char *)0x0;
    }
    else {
      noop.mPosition = (arena._blocks._block._previous)->_position;
      emptyGuard.mPosition = (arena._blocks._block._previous)->_position;
    }
  }
  else {
    noop.mPosition = arena._blocks._block._position;
    emptyGuard.mPosition = arena._blocks._block._position;
  }
  noop.mArena = &arena;
  emptyGuard.mArena = &arena;
  memt::Arena::Guard::~Guard(&emptyGuard);
  memt::Arena::Guard::~Guard(&noop);
  emptyGuard.mPosition = arena._blocks._block._position;
  if (arena._blocks._block._position == arena._blocks._block._begin) {
    if (arena._blocks._block._previous == (Block *)0x0) {
      emptyGuard.mPosition = (char *)0x0;
    }
    else {
      emptyGuard.mPosition = (arena._blocks._block._previous)->_position;
    }
  }
  emptyGuard.mArena = &arena;
  pvVar2 = memt::Arena::alloc(&arena,10000);
  memt::Arena::freeTop((Arena *)&arena._blocks,pvVar2);
  emptyGuard2.mPosition = arena._blocks._block._position;
  if (arena._blocks._block._position == arena._blocks._block._begin) {
    if (arena._blocks._block._previous == (Block *)0x0) {
      emptyGuard2.mPosition = (char *)0x0;
    }
    else {
      emptyGuard2.mPosition = (arena._blocks._block._previous)->_position;
    }
  }
  local_60 = (void *)0x0;
  lVar3 = 0;
  emptyGuard2.mArena = (Arena *)&arena._blocks;
  do {
    if (lVar3 == 3) {
      local_60 = memt::Arena::alloc((Arena *)&arena._blocks,1);
    }
    else if (lVar3 == 6) {
      g1.mPosition = (void *)0x0;
      g1.mArena = (Arena *)CONCAT71(g1.mArena._1_7_,local_60 != (void *)0x0);
      if (local_60 == (void *)0x0) {
        testing::Message::Message((Message *)&g2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&noop,(internal *)&g1,(AssertionResult *)"fromIteration3 != 0","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&g4,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                   ,0x110,(char *)noop.mArena);
        testing::internal::AssertHelper::operator=((AssertHelper *)&g4,(Message *)&g2);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&g1.mPosition);
        bVar1 = memt::Arena::fromArena(&arena,local_60);
        g1.mArena = (Arena *)CONCAT71(g1.mArena._1_7_,bVar1);
        g1.mPosition = (void *)0x0;
        if (bVar1) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&g1.mPosition);
          memt::Arena::freeAndAllAfter(&arena,local_60);
          goto LAB_0010f3cb;
        }
        testing::Message::Message((Message *)&g2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&noop,(internal *)&g1,
                   (AssertionResult *)"arena.fromArena(fromIteration3)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&g4,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                   ,0x111,(char *)noop.mArena);
        testing::internal::AssertHelper::operator=((AssertHelper *)&g4,(Message *)&g2);
      }
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&g4);
      std::__cxx11::string::~string((string *)&noop);
      if (g2.mArena != (Arena *)0x0) {
        (**(code **)(((g2.mArena)->_blocks)._block._begin + 8))();
      }
      goto LAB_0010f3c6;
    }
    noop.mPosition = arena._blocks._block._position;
    if (arena._blocks._block._position == arena._blocks._block._begin) {
      if (arena._blocks._block._previous == (Block *)0x0) {
        noop.mPosition = (char *)0x0;
      }
      else {
        noop.mPosition = (arena._blocks._block._previous)->_position;
      }
    }
    noop.mArena = (Arena *)&arena._blocks;
    memt::Arena::Guard::~Guard(&noop);
    if (arena._blocks._block._position == arena._blocks._block._begin) {
      if (arena._blocks._block._previous == (Block *)0x0) {
        g1.mPosition = (void *)0x0;
        g2.mPosition = (char *)0x0;
      }
      else {
        g1.mPosition = (arena._blocks._block._previous)->_position;
        g2.mPosition = (arena._blocks._block._previous)->_position;
      }
    }
    else {
      g1.mPosition = arena._blocks._block._position;
      g2.mPosition = arena._blocks._block._position;
    }
    g2.mArena = (Arena *)&arena._blocks;
    g1.mArena = (Arena *)&arena._blocks;
    pvVar2 = memt::Arena::alloc((Arena *)&arena._blocks,1);
    bVar1 = memt::Arena::fromArena((Arena *)&arena._blocks,pvVar2);
    g4.mArena = (Arena *)CONCAT71(g4.mArena._1_7_,bVar1);
    g4.mPosition = (void *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&g5);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&noop,(internal *)&g4,(AssertionResult *)"arena.fromArena(tmp)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xfe,(char *)noop.mArena);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&g5);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      std::__cxx11::string::~string((string *)&noop);
      if (g5.mArena != (Arena *)0x0) {
        (**(code **)(((g5.mArena)->_blocks)._block._begin + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&g4.mPosition);
      memt::Arena::Guard::~Guard(&g2);
LAB_0010f204:
      memt::Arena::Guard::~Guard(&g1);
      goto LAB_0010f3cb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&g4.mPosition);
    g2.mArena = (Arena *)0x0;
    memt::Arena::Guard::~Guard(&g2);
    bVar1 = memt::Arena::fromArena((Arena *)&arena._blocks,pvVar2);
    g2.mArena = (Arena *)CONCAT71(g2.mArena._1_7_,bVar1);
    g2.mPosition = (void *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&g4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&noop,(internal *)&g2,(AssertionResult *)"arena.fromArena(tmp)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&g5,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x101,(char *)noop.mArena);
      testing::internal::AssertHelper::operator=((AssertHelper *)&g5,(Message *)&g4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&g5);
      std::__cxx11::string::~string((string *)&noop);
      if (g4.mArena != (Arena *)0x0) {
        (**(code **)(((g4.mArena)->_blocks)._block._begin + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&g2.mPosition);
      goto LAB_0010f204;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&g2.mPosition);
    if (arena._blocks._block._position == arena._blocks._block._begin) {
      if (arena._blocks._block._previous == (Block *)0x0) {
        g2.mPosition = (void *)0x0;
        g4.mPosition = (void *)0x0;
        g5.mPosition = (void *)0x0;
        local_80.mPosition = (char *)0x0;
      }
      else {
        g2.mPosition = (arena._blocks._block._previous)->_position;
        g4.mPosition = (arena._blocks._block._previous)->_position;
        g5.mPosition = (arena._blocks._block._previous)->_position;
        local_80.mPosition = (arena._blocks._block._previous)->_position;
      }
    }
    else {
      g2.mPosition = arena._blocks._block._position;
      g4.mPosition = arena._blocks._block._position;
      g5.mPosition = arena._blocks._block._position;
      local_80.mPosition = arena._blocks._block._position;
    }
    local_80.mArena = (Arena *)0x0;
    g2.mArena = (Arena *)0x0;
    g4.mArena = (Arena *)&arena._blocks;
    g5.mArena = (Arena *)&arena._blocks;
    bVar1 = memt::Arena::fromArena((Arena *)&arena._blocks,pvVar2);
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__2.success_ = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&noop,(internal *)&gtest_ar__2,(AssertionResult *)"arena.fromArena(tmp)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x108,(char *)noop.mArena);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      std::__cxx11::string::~string((string *)&noop);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__2.message_);
    memt::Arena::Guard::~Guard(&local_80);
    memt::Arena::Guard::~Guard(&g5);
    memt::Arena::Guard::~Guard(&g4);
    memt::Arena::Guard::~Guard(&g2);
    memt::Arena::Guard::~Guard(&g1);
    if (!bVar1) goto LAB_0010f3cb;
    bVar1 = memt::Arena::fromArena((Arena *)&arena._blocks,pvVar2);
    g1.mArena = (Arena *)CONCAT71(g1.mArena._1_7_,!bVar1);
    g1.mPosition = (void *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&g2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&noop,(internal *)&g1,(AssertionResult *)"arena.fromArena(tmp)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&g4,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x10a,(char *)noop.mArena);
      testing::internal::AssertHelper::operator=((AssertHelper *)&g4,(Message *)&g2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&g4);
      std::__cxx11::string::~string((string *)&noop);
      if (g2.mArena != (Arena *)0x0) {
        (**(code **)(((g2.mArena)->_blocks)._block._begin + 8))();
      }
LAB_0010f3c6:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&g1.mPosition);
LAB_0010f3cb:
      memt::Arena::Guard::~Guard(&emptyGuard2);
      memt::Arena::Guard::~Guard(&emptyGuard);
      memt::Arena::~Arena(&arena);
      return;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&g1.mPosition);
    size = memt::MemoryBlocks::getMemoryUse(&arena._blocks);
    memt::Arena::alloc((Arena *)&arena._blocks,size);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

TEST(Arena, Guard) {
  memt::Arena arena;
  {
	memt::Arena::Guard noop(arena); // no-op guard
  }

  {
	// double no-op guard
	memt::Arena::Guard guard1(arena);
	memt::Arena::Guard guard2(arena);
  }


  // guard for empty arena with no allocations on it ever
  memt::Arena::Guard emptyGuard(arena);
  arena.freeTop(arena.alloc(10000));
  // guard for empty arena which has allocated some memory previously
  memt::Arena::Guard emptyGuard2(arena);
  // memory use is exponential in number of iterations so do not
  // increase too much.
  void* fromIteration3 = 0;
  for (size_t i = 0; i < 6u; ++i) {
	if (i == 3)
	  fromIteration3 = arena.alloc(1);
	{
	  memt::Arena::Guard noop(arena); // no-op guard
	}
	void* tmp;
	{
	  memt::Arena::Guard g1(arena);
	  {
		memt::Arena::Guard g2(arena);
		tmp = arena.alloc(1);
  	    ASSERT_TRUE(arena.fromArena(tmp));
		g2.release();
	  }
      ASSERT_TRUE(arena.fromArena(tmp)); // released guard did not free
	  memt::Arena::Guard g3(arena);
	  memt::Arena::Guard g4(arena);
	  memt::Arena::Guard g5(arena);
	  memt::Arena::Guard g6(arena);
	  g6.release();
	  g3.release();
	  ASSERT_TRUE(arena.fromArena(tmp));
	}
	ASSERT_FALSE(arena.fromArena(tmp)); // freed despite some guards freed
	// allocate enough memory to force a new block of backing memory
	// inside the arena.
	arena.alloc(arena.getMemoryUse());
  }
  // free a middle allocation to force some blocks to go away
  ASSERT_TRUE(fromIteration3 != 0);
  ASSERT_TRUE(arena.fromArena(fromIteration3));
  arena.freeAndAllAfter(fromIteration3);
}